

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-map.c
# Opt level: O2

void wiz_dark(chunk *c,player *p,_Bool full)

{
  ulong uVar1;
  player_upkeep *ppVar2;
  _Bool _Var3;
  wchar_t wVar4;
  loc lVar5;
  loc grid;
  square *psVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  iVar8 = 1;
  do {
    wVar4 = c->height;
    if (wVar4 + L'\xffffffff' <= iVar8) {
      for (iVar8 = 1; iVar8 < wVar4 + L'\xffffffff'; iVar8 = iVar8 + 1) {
        for (iVar7 = 1; iVar7 < c->width + L'\xffffffff'; iVar7 = iVar7 + 1) {
          lVar5 = (loc)loc(iVar7,iVar8);
          _Var3 = square_in_bounds((chunk_conflict *)c,lVar5);
          if (_Var3) {
            square_unmark((chunk_conflict *)c,lVar5);
          }
        }
        wVar4 = c->height;
      }
      ppVar2 = p->upkeep;
      uVar1._0_4_ = ppVar2->update;
      uVar1._4_4_ = ppVar2->redraw;
      ppVar2->update = (int)(uVar1 | 0xc1000000000060);
      ppVar2->redraw = (int)((uVar1 | 0xc1000000000060) >> 0x20);
      return;
    }
    iVar7 = 1;
    while( true ) {
      if (c->width + L'\xffffffff' <= iVar7) break;
      lVar5 = (loc)loc(iVar7,iVar8);
      _Var3 = square_seemslikewall((chunk_conflict *)c,lVar5);
      if (_Var3) {
LAB_0012711c:
        if (full) {
          square_know_pile((chunk_conflict *)c,lVar5,(_func__Bool_object_ptr *)0x0);
        }
        else {
          square_sense_pile((chunk_conflict *)c,lVar5,(_func__Bool_object_ptr *)0x0);
        }
        _Var3 = square_ismark((chunk_conflict *)c,lVar5);
        if (!_Var3) {
          _Var3 = square_ismemorybad((chunk_conflict *)c,lVar5);
          if (_Var3) {
            square_forget((chunk_conflict *)c,lVar5);
          }
        }
      }
      else {
        _Var3 = square_in_bounds_fully((chunk_conflict *)c,lVar5);
        if (_Var3) {
          for (lVar9 = 0; lVar9 != 9; lVar9 = lVar9 + 1) {
            grid = (loc)loc_sum((loc_conflict)lVar5,(loc_conflict)ddgrid_ddd[lVar9]);
            psVar6 = square((chunk_conflict *)c,grid);
            flag_off(psVar6->info,3,2);
            _Var3 = square_isfloor((chunk_conflict *)c,grid);
            if (_Var3) {
              _Var3 = square_isvisibletrap((chunk_conflict *)c,grid);
              if (_Var3) goto LAB_001271a3;
            }
            else {
LAB_001271a3:
              square_memorize((chunk_conflict *)c,grid);
              square_mark((chunk_conflict *)c,grid);
            }
          }
          goto LAB_0012711c;
        }
      }
      iVar7 = iVar7 + 1;
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

void wiz_dark(struct chunk *c, struct player *p, bool full)
{
	int i, y, x;

	/* Scan all grids */
	for (y = 1; y < c->height - 1; y++) {
		for (x = 1; x < c->width - 1; x++) {
			struct loc grid = loc(x, y);

			/* Process all non-walls */
			if (!square_seemslikewall(c, grid)) {
				if (!square_in_bounds_fully(c, grid)) continue;

				/* Scan all neighbors */
				for (i = 0; i < 9; i++) {
					struct loc a_grid = loc_sum(grid, ddgrid_ddd[i]);

					/* Perma-darken the grid */
					sqinfo_off(square(c, a_grid)->info, SQUARE_GLOW);

					/* Memorize normal features */
					if (!square_isfloor(c, a_grid) || 
						square_isvisibletrap(c, a_grid)) {
						square_memorize(c, a_grid);
						square_mark(c, a_grid);
					}
				}
			}

			/* Memorize objects */
			if (full) {
				square_know_pile(c, grid, NULL);
			} else {
				square_sense_pile(c, grid, NULL);
			}

			/*
			 * Forget grids that are both unprocessed and
			 * misremembered in the mapping area.
			 */
			if (!square_ismark(c, grid)
					&& square_ismemorybad(c, grid)) {
				square_forget(c, grid);
			}
		}
	}

	/* Unmark grids */
	for (y = 1; y < c->height - 1; y++) {
		for (x = 1; x < c->width - 1; x++) {
			struct loc grid = loc(x, y);
			if (!square_in_bounds(c, grid)) continue;
			square_unmark(c, grid);
		}
	}

	/* Fully update the visuals */
	p->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);

	/* Redraw whole map, monster list */
	p->upkeep->redraw |= (PR_MAP | PR_MONLIST | PR_ITEMLIST);
}